

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

void * adt_ary_value(adt_ary_t *self,int32_t s32Index)

{
  int local_1c;
  int32_t s32Index_local;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    self_local = (adt_ary_t *)0x0;
  }
  else {
    local_1c = s32Index;
    if (s32Index < 0) {
      local_1c = self->s32CurLen + s32Index;
    }
    self_local = (adt_ary_t *)self->pFirst[local_1c];
  }
  return self_local;
}

Assistant:

void* adt_ary_value(const adt_ary_t *self, int32_t s32Index)
{
	if(self==0){
		return (void*) 0;
	}
	if(s32Index<0){
		//negative index inside array bounds ensured by caller
		s32Index=self->s32CurLen+s32Index;
	}
	return self->pFirst[s32Index];
}